

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O3

Constant *
spvtools::opt::anon_unknown_0::FoldScalarFPDivide
          (Type *result_type,Constant *numerator,Constant *denominator,ConstantManager *const_mgr)

{
  double dVar1;
  double dVar2;
  int iVar3;
  Constant *pCVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *__assertion;
  float fVar5;
  float fVar6;
  FloatProxy<double> result_in_macro;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words_in_macro;
  FloatProxy<double> local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  if (denominator != (Constant *)0x0) {
    iVar3 = (*denominator->_vptr_Constant[0x17])(denominator);
    if ((char)iVar3 != '\0') {
      pCVar4 = FoldFPScalarDivideByZero(result_type,numerator,const_mgr);
      return pCVar4;
    }
    iVar3 = (*denominator->type_->_vptr_Type[0xc])();
    iVar3 = *(int *)(CONCAT44(extraout_var,iVar3) + 0x24);
    if ((iVar3 == 0x40) || (iVar3 == 0x20)) {
      iVar3 = (*denominator->_vptr_Constant[0xf])(denominator);
      if (CONCAT44(extraout_var_00,iVar3) != 0) {
        dVar1 = analysis::Constant::GetValueAsDouble(denominator);
        if ((dVar1 == 0.0) && (!NAN(dVar1))) {
          pCVar4 = FoldFPScalarDivideByZero(result_type,numerator,const_mgr);
          if (pCVar4 == (Constant *)0x0) {
            return (Constant *)0x0;
          }
          pCVar4 = NegateFPConst(result_type,pCVar4,const_mgr);
          return pCVar4;
        }
      }
      if ((result_type == (Type *)0x0) || (numerator == (Constant *)0x0)) {
        __assertion = "result_type_in_macro != nullptr && a != nullptr && b != nullptr";
      }
      else if ((numerator->type_ == result_type) && (denominator->type_ == result_type)) {
        iVar3 = (*result_type->_vptr_Type[0xc])(result_type);
        if (CONCAT44(extraout_var_01,iVar3) != 0) {
          iVar3 = *(int *)(CONCAT44(extraout_var_01,iVar3) + 0x24);
          if (iVar3 == 0x40) {
            dVar1 = analysis::Constant::GetDouble(numerator);
            dVar2 = analysis::Constant::GetDouble(denominator);
            local_40.data_ = (uint_type)(dVar1 / dVar2);
            utils::FloatProxy<double>::GetWords(&local_38,&local_40);
          }
          else {
            if (iVar3 != 0x20) {
              return (Constant *)0x0;
            }
            fVar5 = analysis::Constant::GetFloat(numerator);
            fVar6 = analysis::Constant::GetFloat(denominator);
            local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_40.data_._0_4_ = fVar5 / fVar6;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(&local_38,(iterator)0x0,(uint *)&local_40);
          }
          pCVar4 = analysis::ConstantManager::GetConstant(const_mgr,result_type,&local_38);
          if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_38.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_38.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            return pCVar4;
          }
          return pCVar4;
        }
        __assertion = "float_type_in_macro != nullptr";
      }
      else {
        __assertion = "result_type_in_macro == a->type() && result_type_in_macro == b->type()";
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                    ,0x411,
                    "auto spvtools::opt::(anonymous namespace)::FoldScalarFPDivide(const analysis::Type *, const analysis::Constant *, const analysis::Constant *, analysis::ConstantManager *)::(anonymous class)::operator()(const analysis::Type *, const analysis::Constant *, const analysis::Constant *, analysis::ConstantManager *) const"
                   );
    }
  }
  return (Constant *)0x0;
}

Assistant:

const analysis::Constant* FoldScalarFPDivide(
    const analysis::Type* result_type, const analysis::Constant* numerator,
    const analysis::Constant* denominator,
    analysis::ConstantManager* const_mgr) {
  if (denominator == nullptr) {
    return nullptr;
  }

  if (denominator->IsZero()) {
    return FoldFPScalarDivideByZero(result_type, numerator, const_mgr);
  }

  uint32_t width = denominator->type()->AsFloat()->width();
  if (width != 32 && width != 64) {
    return nullptr;
  }

  const analysis::FloatConstant* denominator_float =
      denominator->AsFloatConstant();
  if (denominator_float && denominator->GetValueAsDouble() == -0.0) {
    const analysis::Constant* result =
        FoldFPScalarDivideByZero(result_type, numerator, const_mgr);
    if (result != nullptr)
      result = NegateFPConst(result_type, result, const_mgr);
    return result;
  } else {
    return FOLD_FPARITH_OP(/)(result_type, numerator, denominator, const_mgr);
  }
}